

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrt.cpp
# Opt level: O2

void pbrt::CleanupPBRT(void)

{
  bool bVar1;
  code *local_28 [2];
  code *local_18;
  code *local_10;
  
  local_28[1] = (code *)0x0;
  local_28[0] = ReportThreadStats;
  local_10 = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
  local_18 = std::_Function_handler<void_(),_void_(*)()>::_M_manager;
  ForEachThread((function<void_()> *)local_28);
  std::_Function_base::~_Function_base((_Function_base *)local_28);
  if (*(char *)(Options + 0x19) == '\x01') {
    StatsWritePixelImages();
  }
  if (*(char *)(Options + 4) == '\0') {
    PrintStats(_stdout);
    ClearStats();
  }
  bVar1 = PrintCheckRare(_stdout);
  if (!bVar1) {
    if (*(long *)(Options + 0xb8) != 0) {
      DisconnectFromDisplayServer();
    }
    ParallelCleanup();
    Options = 0;
    return;
  }
  ErrorExit<>("CHECK_RARE failures");
}

Assistant:

void CleanupPBRT() {
    ForEachThread(ReportThreadStats);

    if (Options->recordPixelStatistics)
        StatsWritePixelImages();

    if (!Options->quiet) {
        PrintStats(stdout);
        ClearStats();
    }
    if (PrintCheckRare(stdout))
        ErrorExit("CHECK_RARE failures");

    if (!Options->displayServer.empty())
        DisconnectFromDisplayServer();

    // API Cleanup
    ParallelCleanup();

    // CO    delete Options;
    Options = nullptr;
}